

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

char * get_func_static_var_name(c2m_ctx_t c2m_ctx,char *suffix,decl_t decl)

{
  gen_ctx_conflict *pgVar1;
  VARR_char *pVVar2;
  MIR_item_t pMVar3;
  MIR_module_t pMVar4;
  MIR_item_t pMVar5;
  MIR_item_t_conflict pMVar6;
  char *name;
  MIR_item_t pMVar7;
  int *piVar8;
  c2m_ctx_t pcVar9;
  DLIST_MIR_item_t *list;
  str_t sVar10;
  char prefix [50];
  char acStack_58 [64];
  
  sprintf(acStack_58,"S%u_",(ulong)*(uint *)((long)decl->scope->attr + 4));
  pgVar1 = c2m_ctx->gen_ctx;
  if (pgVar1->curr_func == (MIR_item_t)0x0) {
LAB_001ab918:
    __assert_fail("curr_func != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x2b4e,"const char *get_func_var_name(c2m_ctx_t, const char *, const char *)");
  }
  pVVar2 = c2m_ctx->temp_string;
  if ((pVVar2 == (VARR_char *)0x0) || (pVVar2->varr == (char *)0x0)) {
    get_func_static_var_name_cold_2();
    goto LAB_001ab918;
  }
  pVVar2->els_num = 0;
  add_to_temp_string(c2m_ctx,acStack_58);
  add_to_temp_string(c2m_ctx,((pgVar1->curr_func->u).func)->name);
  add_to_temp_string(c2m_ctx,"_");
  pcVar9 = c2m_ctx;
  add_to_temp_string(c2m_ctx,suffix);
  if (c2m_ctx->temp_string != (VARR_char *)0x0) {
    sVar10 = uniq_cstr(c2m_ctx,c2m_ctx->temp_string->varr);
    return sVar10.s;
  }
  get_func_static_var_name_cold_1();
  pgVar1 = pcVar9->gen_ctx;
  pMVar7 = pgVar1->curr_func;
  if (pMVar7 == (MIR_item_t)0x0) {
    __assert_fail("curr_func != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x2d6f,"void move_item_forward(c2m_ctx_t, MIR_item_t)");
  }
  if ((pMVar7->module->items).tail != (MIR_item_t)suffix) {
    return (char *)pMVar7;
  }
  list = &pMVar7->module->items;
  pMVar7 = (MIR_item_t)suffix;
  DLIST_MIR_item_t_remove(list,(MIR_item_t)suffix);
  if ((((MIR_item_t)suffix == (MIR_item_t)0x0) ||
      (pMVar3 = pgVar1->curr_func, pMVar3 == (MIR_item_t)0x0)) ||
     (pMVar4 = pMVar3->module, (pMVar4->items).tail == (MIR_item_t_conflict)0x0)) {
    move_item_forward_cold_3();
LAB_001ab9f1:
    move_item_forward_cold_1();
  }
  else {
    pMVar5 = (pMVar3->item_link).prev;
    pMVar7 = (pMVar4->items).head;
    if (pMVar5 != (MIR_item_t)0x0) {
      if (pMVar7 != (MIR_item_t)0x0) {
        (pMVar5->item_link).next = (MIR_item_t)suffix;
        (((MIR_item_t)suffix)->item_link).prev = pMVar5;
        (pMVar3->item_link).prev = (MIR_item_t)suffix;
        (((MIR_item_t)suffix)->item_link).next = pMVar3;
        return (char *)pMVar3;
      }
      goto LAB_001ab9f1;
    }
    if (pMVar7 == pMVar3) {
      (pMVar3->item_link).prev = (MIR_item_t)suffix;
      (((MIR_item_t)suffix)->item_link).next = pMVar3;
      (((MIR_item_t)suffix)->item_link).prev = (MIR_item_t)0x0;
      (pMVar4->items).head = (MIR_item_t_conflict)suffix;
      return (char *)pMVar3;
    }
  }
  move_item_forward_cold_2();
  pMVar4 = pMVar7->module;
  if (*(int *)&pMVar7->data == 0x7d) {
LAB_001aba46:
    if (*(int *)&pMVar4[1].data != 0x58) {
      pMVar6 = MIR_new_forward((MIR_context_t)list->head,name);
      return (char *)pMVar6;
    }
    pMVar6 = MIR_new_export((MIR_context_t)list->head,name);
    return (char *)pMVar6;
  }
  if (*(int *)&pMVar7->data == 0x55) {
    piVar8 = *(int **)&pMVar7->item_type;
    if (piVar8 != (int *)0x0) {
      piVar8 = *(int **)(piVar8 + 6);
    }
    if (((*piVar8 == 0x5d) && ((pMVar4->items).tail == list[0x18].head)) &&
       ((*(int *)(pMVar4[1].name + 0x18) != 7 && (((ulong)(pMVar4->module_link).next & 3) == 0))))
    goto LAB_001aba46;
  }
  return (char *)0x0;
}

Assistant:

static const char *get_func_static_var_name (c2m_ctx_t c2m_ctx, const char *suffix, decl_t decl) {
  char prefix[50];
  unsigned func_scope_num = ((struct node_scope *) decl->scope->attr)->func_scope_num;

  sprintf (prefix, "S%u_", func_scope_num);
  return get_func_var_name (c2m_ctx, prefix, suffix);
}